

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_twod_node(REF_NODE ref_node)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  REF_DBL local_58 [2];
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar4 = 0;
  do {
    if (ref_node->max <= lVar4) {
      return 0;
    }
    if (-1 < ref_node->global[lVar4]) {
      uVar1 = ref_node_metric_get(ref_node,(REF_INT)lVar4,local_58);
      if (uVar1 != 0) {
        pcVar3 = "get";
        uVar2 = 0x18c;
LAB_001994a0:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar2,"ref_metric_twod_node",(ulong)uVar1,pcVar3);
        return uVar1;
      }
      local_48 = 0;
      local_38 = 0;
      uStack_30 = 0x3ff0000000000000;
      uVar1 = ref_node_metric_set(ref_node,(REF_INT)lVar4,local_58);
      if (uVar1 != 0) {
        pcVar3 = "set";
        uVar2 = 400;
        goto LAB_001994a0;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_twod_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL m[6];

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    m[2] = 0.0;
    m[4] = 0.0;
    m[5] = 1.0;
    RSS(ref_node_metric_set(ref_node, node, m), "set");
  }

  return REF_SUCCESS;
}